

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxAddSub::Resolve(FxAddSub *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PString *pPVar2;
  PInt *pPVar3;
  PFloat *pPVar4;
  bool bVar5;
  int iVar6;
  FxExpression *pFVar7;
  int iVar8;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *pTVar9;
  int iVar10;
  int iVar11;
  FString FVar12;
  FString local_48;
  FxJumpStatement **local_40;
  FxJumpStatement **local_38;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved == false) {
    (this->super_FxBinary).super_FxExpression.isresolved = true;
    bVar5 = FxBinary::ResolveLR(&this->super_FxBinary,ctx,false);
    if (bVar5) {
      pPVar1 = (this->super_FxBinary).super_FxExpression.ValueType;
      if ((pPVar1 != (PType *)TypeName) &&
         ((iVar6 = (**(code **)(*(long *)&pPVar1->super_DObject + 0x90))(), iVar6 == 0 ||
          (iVar6 = (*(((this->super_FxBinary).super_FxExpression.ValueType)->super_DObject).
                     _vptr_DObject[0x12])(), iVar6 == 1)))) {
        iVar6 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if (((char)iVar6 != '\0') &&
           (iVar6 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (char)iVar6 != '\0')
           ) {
          iVar6 = (*(((this->super_FxBinary).super_FxExpression.ValueType)->super_DObject).
                    _vptr_DObject[0x12])();
          if (iVar6 == 1) {
            pFVar7 = (this->super_FxBinary).left;
            pPVar2 = (PString *)pFVar7[1]._vptr_FxExpression;
            pTVar9 = &pFVar7[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_48,(FString *)pTVar9);
            }
            else {
              local_48.Chars = (char *)pTVar9->Array;
            }
            iVar6 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            local_40 = (FxJumpStatement **)local_48.Chars;
            if ((iVar6 != 1) && (local_40 = (FxJumpStatement **)0x0, iVar6 == 0)) {
              local_40 = (FxJumpStatement **)(double)(int)local_48.Chars;
            }
            if (pPVar2 == TypeString) {
              FString::~FString(&local_48);
            }
            pFVar7 = (this->super_FxBinary).right;
            pPVar2 = (PString *)pFVar7[1]._vptr_FxExpression;
            pTVar9 = &pFVar7[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_48,(FString *)pTVar9);
            }
            else {
              local_48.Chars = (char *)pTVar9->Array;
            }
            iVar6 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            FVar12.Chars = local_48.Chars;
            if ((iVar6 != 1) && (FVar12.Chars = (char *)(FxJumpStatement **)0x0, iVar6 == 0)) {
              FVar12.Chars = (char *)(double)(int)local_48.Chars;
            }
            if (pPVar2 == TypeString) {
              local_38 = (FxJumpStatement **)FVar12.Chars;
              FString::~FString(&local_48);
              FVar12.Chars = (char *)local_38;
            }
            iVar6 = *(int *)&(this->super_FxBinary).super_FxExpression.field_0x34;
            if (iVar6 == 0x2b) {
              local_40 = (FxJumpStatement **)((double)local_40 + (double)FVar12.Chars);
            }
            else if (iVar6 == 0x2d) {
              local_40 = (FxJumpStatement **)((double)local_40 - (double)FVar12.Chars);
            }
            else {
              local_40 = (FxJumpStatement **)0x0;
            }
            pFVar7 = (FxExpression *)operator_new(0x48);
            FxExpression::FxExpression
                      (pFVar7,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
            pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar4 = TypeFloat64;
            pFVar7[1]._vptr_FxExpression = (_func_int **)TypeFloat64;
            pFVar7->ValueType = (PType *)pPVar4;
            pFVar7[1].JumpAddresses.Array = local_40;
          }
          else {
            pFVar7 = (this->super_FxBinary).left;
            pPVar2 = (PString *)pFVar7[1]._vptr_FxExpression;
            pTVar9 = &pFVar7[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_48,(FString *)pTVar9);
            }
            else {
              local_48.Chars = (char *)pTVar9->Array;
            }
            iVar6 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            if (iVar6 == 1) {
              iVar10 = (int)(double)local_48.Chars;
            }
            else {
              iVar10 = 0;
              if (iVar6 == 0) {
                iVar10 = (int)local_48.Chars;
              }
            }
            if (pPVar2 == TypeString) {
              FString::~FString(&local_48);
            }
            pFVar7 = (this->super_FxBinary).right;
            pPVar2 = (PString *)pFVar7[1]._vptr_FxExpression;
            pTVar9 = &pFVar7[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_48,(FString *)pTVar9);
            }
            else {
              local_48.Chars = (char *)pTVar9->Array;
            }
            iVar6 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            if (iVar6 == 1) {
              iVar11 = (int)(double)local_48.Chars;
            }
            else {
              iVar11 = 0;
              if (iVar6 == 0) {
                iVar11 = (int)local_48.Chars;
              }
            }
            if (pPVar2 == TypeString) {
              FString::~FString(&local_48);
            }
            iVar6 = *(int *)&(this->super_FxBinary).super_FxExpression.field_0x34;
            pFVar7 = (FxExpression *)operator_new(0x48);
            FxExpression::FxExpression
                      (pFVar7,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
            iVar8 = 0;
            if (iVar6 == 0x2d) {
              iVar8 = iVar10 - iVar11;
            }
            if (iVar6 == 0x2b) {
              iVar8 = iVar10 + iVar11;
            }
            pFVar7->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar3 = TypeSInt32;
            pFVar7[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
            pFVar7->ValueType = (PType *)pPVar3;
            *(int *)&pFVar7[1].JumpAddresses.Array = iVar8;
          }
          pFVar7->isresolved = true;
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
          return pFVar7;
        }
        FxBinary::Promote(&this->super_FxBinary,ctx);
        return (FxExpression *)this;
      }
      FScriptPosition::Message
                (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,"Numeric type expected"
                );
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
    }
    this = (FxAddSub *)0x0;
  }
  return (FxExpression *)this;
}

Assistant:

FxExpression *FxAddSub::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (!ResolveLR(ctx, true)) return NULL;

	if (!IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
	else if (left->isConstant() && right->isConstant())
	{
		if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v;
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;
		}
		else
		{
			int v;
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

			v =	Operator == '+'? v1 + v2 : 
				Operator == '-'? v1 - v2 : 0;

			FxExpression *e = new FxConstant(v, ScriptPosition);
			delete this;
			return e;

		}
	}
	Promote(ctx);
	return this;
}